

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# element.cpp
# Opt level: O3

bool __thiscall IntElemDomain<0,_4,_0>::propagate(IntElemDomain<0,_4,_0> *this)

{
  uint *puVar1;
  int *piVar2;
  bool bVar3;
  int iVar4;
  uint uVar5;
  int iVar6;
  uint uVar7;
  int iVar8;
  uint uVar9;
  _func_int **pp_Var10;
  IntVar *pIVar11;
  int iVar12;
  Tchar *pTVar13;
  ulong uVar14;
  IntVar *pIVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  long lVar20;
  int *pt;
  Tint *pTVar21;
  IntView<0> *pIVar22;
  long lVar23;
  int iVar24;
  TrailElem local_50;
  IntVar *local_40;
  long local_38;
  
  pIVar15 = (this->y).var;
  iVar8 = (pIVar15->min).v;
  lVar23 = (long)iVar8;
  if (iVar8 <= (pIVar15->max).v) {
    do {
      if (((pIVar15->min).v <= lVar23) &&
         ((pIVar15->vals == (Tchar *)0x0 || (pIVar15->vals[lVar23].v != '\0')))) {
        puVar1 = (uint *)this->support[lVar23];
        pTVar21 = this->num_support + lVar23;
        uVar7 = pTVar21->v;
        if ((int)uVar7 < 1) {
          if ((ulong)uVar7 == 0) goto LAB_001a3e7c;
          bVar3 = false;
          uVar14 = 0;
LAB_001a3df4:
          iVar8 = (int)uVar14;
          if (iVar8 < (int)uVar7) {
            uVar18 = uVar14 & 0xffffffff;
            do {
              puVar1[uVar18 - (long)iVar8] = puVar1[uVar18];
              uVar18 = uVar18 + 1;
              uVar7 = pTVar21->v;
            } while ((long)uVar18 < (long)(int)uVar7);
          }
          iVar4 = uVar7 - iVar8;
          if (bVar3) {
            piVar2 = this->temp_sup;
            uVar18 = 0;
            do {
              puVar1[(long)iVar4 + uVar18] = piVar2[uVar18];
              uVar18 = uVar18 + 1;
            } while ((uVar14 & 0xffffffff) != uVar18);
            uVar7 = pTVar21->v;
            iVar4 = uVar7 - iVar8;
          }
          local_50.sz = 4;
          local_50.pt = &pTVar21->v;
          local_50.x = uVar7;
          vec<TrailElem>::push(&engine.trail,&local_50);
          pTVar21->v = iVar4;
        }
        else {
          lVar16 = (long)(this->x).b;
          lVar20 = (int)*puVar1 - lVar16;
          pIVar15 = (this->x).var;
          lVar17 = (long)(pIVar15->min).v;
          lVar19 = (long)(pIVar15->max).v;
          if (((((lVar20 < lVar17) || (lVar19 < lVar20)) ||
               ((pIVar15->vals != (Tchar *)0x0 && (pIVar15->vals[lVar20].v == '\0')))) ||
              ((pIVar11 = (this->a).data[*puVar1].var, lVar23 < (pIVar11->min).v ||
               ((pIVar11->max).v < lVar23)))) ||
             ((pIVar11->vals != (Tchar *)0x0 && (pIVar11->vals[lVar23].v == '\0')))) {
            uVar5 = 0;
            uVar14 = 0;
            do {
              lVar20 = (int)puVar1[uVar14] - lVar16;
              if ((((lVar17 <= lVar20) && (lVar20 <= lVar19)) &&
                  ((pIVar15->vals == (Tchar *)0x0 || (pIVar15->vals[lVar20].v != '\0')))) &&
                 (((pIVar11 = (this->a).data[puVar1[uVar14]].var, (pIVar11->min).v <= lVar23 &&
                   (lVar23 <= (pIVar11->max).v)) &&
                  ((pIVar11->vals == (Tchar *)0x0 || (pIVar11->vals[lVar23].v != '\0')))))) {
                if (uVar7 != (uint)uVar14) {
                  bVar3 = uVar14 != 0;
                  if (uVar14 == 0) {
                    bVar3 = false;
                  }
                  else {
                    piVar2 = this->temp_sup;
                    uVar18 = 0;
                    do {
                      piVar2[uVar18] = puVar1[uVar18];
                      uVar18 = uVar18 + 1;
                    } while (uVar5 != uVar18);
                    uVar7 = pTVar21->v;
                  }
                  goto LAB_001a3df4;
                }
                break;
              }
              uVar14 = uVar14 + 1;
              uVar5 = uVar5 + 1;
            } while (uVar7 != uVar14);
LAB_001a3e7c:
            if (so.lazy == true) {
              pIVar15 = (this->x).var;
              iVar8 = ((pIVar15->max).v - (pIVar15->min).v) + 4;
              local_50.pt = (int *)malloc((long)iVar8 * 4 + 8);
              ((Tint *)local_50.pt)->v = iVar8 * 0x100 | 2;
              vec<Clause_*>::push(sat.rtrail.data + (sat.rtrail.sz - 1),(Clause **)&local_50);
              pTVar21 = (Tint *)local_50.pt;
              iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[8])();
              if ((uint)*&pTVar21->v < 0x200) {
LAB_001a42c1:
                abort();
              }
              ((Tint *)(&pTVar21->v + 2))->v = iVar8;
              iVar8 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[9])();
              if ((uint)*&pTVar21->v < 0x300) goto LAB_001a42c1;
              ((Tint *)(&pTVar21->v + 3))->v = iVar8;
              pIVar15 = (this->x).var;
              iVar4 = (pIVar15->min).v;
              iVar6 = (pIVar15->max).v;
              iVar12 = (this->x).b;
              iVar8 = iVar12 + iVar4;
              if (iVar8 <= iVar12 + iVar6) {
                iVar4 = iVar4 + iVar12 + 3;
                uVar14 = (long)iVar8;
                do {
                  iVar8 = (pIVar15->min).v;
                  iVar24 = (iVar4 - iVar12) - iVar8;
                  lVar16 = uVar14 - (long)iVar12;
                  if (((iVar6 < lVar16) || (lVar16 < iVar8)) ||
                     ((pIVar15->vals != (Tchar *)0x0 &&
                      (pIVar15->vals[uVar14 - (long)iVar12].v == '\0')))) {
                    pp_Var10 = (pIVar15->super_Var).super_Branching._vptr_Branching;
                  }
                  else {
                    pIVar15 = (this->a).data[uVar14 & 0xffffffff].var;
                    pp_Var10 = (pIVar15->super_Var).super_Branching._vptr_Branching;
                    lVar16 = lVar23;
                  }
                  uVar7 = (*pp_Var10[0xd])(pIVar15,lVar16,0);
                  if ((int)((uint)*&pTVar21->v >> 8) <= iVar24) goto LAB_001a42c1;
                  ((Tint *)(&pTVar21->v + (long)iVar24 + 1))->v = uVar7 ^ 1;
                  pIVar15 = (this->x).var;
                  iVar6 = (pIVar15->max).v;
                  iVar12 = (this->x).b;
                  iVar4 = iVar4 + 1;
                  bVar3 = (long)uVar14 < (long)(iVar12 + iVar6);
                  uVar14 = uVar14 + 1;
                } while (bVar3);
              }
            }
            else {
              pTVar21 = (Tint *)0x0;
            }
            pIVar15 = (this->y).var;
            iVar8 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0x11])
                              (pIVar15,lVar23,pTVar21,1);
            if ((char)iVar8 == '\0') {
              return false;
            }
          }
        }
      }
      pIVar15 = (this->y).var;
      bVar3 = lVar23 < (pIVar15->max).v;
      lVar23 = lVar23 + 1;
    } while (bVar3);
  }
  pIVar11 = (this->x).var;
  iVar8 = (pIVar11->min).v;
  if (iVar8 != (pIVar11->max).v) {
    return true;
  }
  uVar7 = (this->x).b + iVar8;
  pIVar22 = (this->a).data;
  pIVar11 = pIVar22[uVar7].var;
  pIVar22 = pIVar22 + uVar7;
  iVar8 = (pIVar11->min).v;
  iVar4 = (pIVar15->min).v;
  if (iVar4 < iVar8) {
    if (so.lazy == true) {
      iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[8])(pIVar11);
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar15 = (this->y).var;
    }
    else {
      uVar14 = 0;
    }
    iVar8 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar15,(long)iVar8,uVar14,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
    pIVar15 = (this->y).var;
    iVar4 = (pIVar15->min).v;
    pIVar11 = pIVar22->var;
    iVar8 = (pIVar11->min).v;
  }
  if (iVar8 < iVar4) {
    if (so.lazy == true) {
      iVar8 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[8])();
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar5 << 0x20 | (long)iVar8 << 2 | 3;
      pIVar11 = pIVar22->var;
    }
    else {
      uVar14 = 0;
    }
    iVar8 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xe])
                      (pIVar11,(long)iVar4,uVar14,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
    pIVar11 = pIVar22->var;
    pIVar15 = (this->y).var;
  }
  iVar8 = (pIVar11->max).v;
  iVar4 = (pIVar15->max).v;
  if (iVar8 < iVar4) {
    if (so.lazy == true) {
      iVar4 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[9])(pIVar11);
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar5 << 0x20 | (long)iVar4 << 2 | 3;
      pIVar15 = (this->y).var;
    }
    else {
      uVar14 = 0;
    }
    iVar8 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar15,(long)iVar8,uVar14,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
    pIVar15 = (this->y).var;
    iVar4 = (pIVar15->max).v;
    pIVar11 = pIVar22->var;
    iVar8 = (pIVar11->max).v;
  }
  if (iVar4 < iVar8) {
    if (so.lazy == true) {
      iVar8 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[9])();
      uVar5 = (*(((this->x).var)->super_Var).super_Branching._vptr_Branching[10])();
      uVar14 = (ulong)uVar5 << 0x20 | (long)iVar8 << 2 | 3;
      pIVar11 = pIVar22->var;
    }
    else {
      uVar14 = 0;
    }
    iVar8 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xf])
                      (pIVar11,(long)iVar4,uVar14,1);
    if ((char)iVar8 == '\0') {
      return false;
    }
  }
  pIVar22 = (this->a).data;
  pIVar15 = pIVar22[uVar7].var;
  local_38 = (long)(int)uVar7;
  iVar8 = (pIVar15->min).v;
  local_40 = pIVar15;
  while( true ) {
    do {
      if (iVar8 == (pIVar15->max).v) {
        iVar4 = -0x80000000;
      }
      else {
        pTVar13 = pIVar15->vals + iVar8;
        iVar4 = iVar8;
        do {
          pTVar13 = pTVar13 + 1;
          iVar4 = iVar4 + 1;
        } while (pTVar13->v == '\0');
      }
      lVar23 = (long)iVar8;
      pIVar11 = (this->y).var;
    } while ((((pIVar11->min).v <= iVar8) && (iVar8 <= (pIVar11->max).v)) &&
            ((iVar8 = iVar4, pIVar11->vals == (Tchar *)0x0 || (pIVar11->vals[lVar23].v != '\0'))));
    if (so.lazy == true) {
      uVar5 = (*(pIVar11->super_Var).super_Branching._vptr_Branching[0xd])(pIVar11,lVar23,0);
      pIVar15 = (this->x).var;
      uVar9 = (*(pIVar15->super_Var).super_Branching._vptr_Branching[0xd])
                        (pIVar15,local_38 - (this->x).b,1);
      uVar14 = (ulong)(uVar9 ^ 1) << 0x20 | (long)(int)(uVar5 ^ 1) << 2 | 3;
      pIVar15 = local_40;
    }
    else {
      uVar14 = 0;
    }
    iVar8 = (*((pIVar22[uVar7].var)->super_Var).super_Branching._vptr_Branching[0x11])
                      (pIVar22[uVar7].var,lVar23,uVar14,1);
    if ((char)iVar8 == '\0') break;
    pIVar22 = (this->a).data;
    iVar8 = iVar4;
  }
  return false;
}

Assistant:

bool propagate() override {
		// propagate holes in y
		for (int v = static_cast<int>(y.getMin()); v <= static_cast<int>(y.getMax()); v++) {
			if (!y.indomain(v)) {
				continue;
			}
			int* s = support[v];
			int f = 0;
			if (num_support[v] > 0) {
				if (x.indomain(s[0]) && a[s[0]].indomain(v)) {
					continue;
				}
				while (!(x.indomain(s[f]) && a[s[f]].indomain(v)) && ++f < num_support[v]) {
					;
				}
			}
			if (f == num_support[v]) {
				// v has no support, remove from y
				Clause* r = nullptr;
				if (so.lazy) {
					r = Reason_new(static_cast<int>(x.getMax() + 4 - x.getMin()));
					(*r)[1] = x.getMinLit();
					(*r)[2] = x.getMaxLit();
					for (int i = static_cast<int>(x.getMin()); i <= static_cast<int>(x.getMax()); i++) {
						const int reasonIndex = static_cast<int>(3 + i - x.getMin());
						if (x.indomain(i)) {
							const Lit l = ~a[i].getLit(v, LR_NE);
							(*r)[reasonIndex] = l;
						} else {
							const Lit l = ~x.getLit(i, LR_NE);
							(*r)[reasonIndex] = l;
						}
					}
				}
				if (!y.remVal(v, r)) {
					return false;
				}
			} else {
				// shift bad supports to back
				for (int i = 0; i < f; i++) {
					temp_sup[i] = s[i];
				}
				for (int i = f; i < num_support[v]; i++) {
					s[i - f] = s[i];
				}
				s += num_support[v] - f;
				for (int i = 0; i < f; i++) {
					s[i] = temp_sup[i];
				}
				num_support[v] -= f;
			}
		}

		// propagate holes in x
		// just ignore

		// propagate holes in a_i
		if (x.isFixed()) {
			const int v = static_cast<int>(x.getVal());
			const IntView<W>& f = a[v];
			setDom(y, setMin, f.getMin(), f.getMinLit(), x.getValLit());
			setDom(f, setMin, y.getMin(), y.getMinLit(), x.getValLit());
			setDom(y, setMax, f.getMax(), f.getMaxLit(), x.getValLit());
			setDom(f, setMax, y.getMax(), y.getMaxLit(), x.getValLit());
			for (typename IntView<W>::iterator i = a[v].begin(); i != a[v].end();) {
				const int w = *i++;
				if (!y.indomain(w) &&
						!a[v].remVal(w,
												 so.lazy ? Reason(~y.getLit(w, LR_NE), ~x.getLit(v, LR_EQ)) : Reason())) {
					return false;
				}
			}
		}

		return true;
	}